

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O3

string * FindInstallSource_abi_cxx11_
                   (string *__return_storage_ptr__,cmMakefile *makefile,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_type sVar3;
  string *psVar4;
  string *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string *extraout_RAX_00;
  size_type *psVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string ts;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 *local_90;
  undefined8 local_88;
  size_t local_80;
  char *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  bVar2 = cmsys::SystemTools::FileIsFullPath(name);
  if (bVar2) {
LAB_0039991d:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,name,(allocator<char> *)local_b0._M_local_buf);
    return extraout_RAX;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0._M_local_buf,name,(allocator<char> *)&local_68);
  sVar3 = cmGeneratorExpression::Find((string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_allocated_capacity != &local_a0) {
    operator_delete((void *)local_b0._M_allocated_capacity,local_a0._M_allocated_capacity + 1);
  }
  if (sVar3 == 0) goto LAB_0039991d;
  psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(makefile);
  local_b0._8_8_ = (psVar4->_M_dataplus)._M_p;
  local_b0._M_allocated_capacity = psVar4->_M_string_length;
  local_a0._M_allocated_capacity = 0;
  local_68 = 0;
  local_60 = 1;
  local_50[0] = 0x2f;
  local_a0._8_8_ = 1;
  local_88 = 0;
  local_90 = local_50;
  local_58 = local_50;
  local_80 = strlen(name);
  local_70 = 0;
  views._M_len = 3;
  views._M_array = (iterator)&local_b0;
  local_78 = name;
  cmCatViews((string *)&local_f0,views);
  psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(makefile);
  local_b0._8_8_ = (psVar4->_M_dataplus)._M_p;
  local_b0._M_allocated_capacity = psVar4->_M_string_length;
  local_a0._M_allocated_capacity = 0;
  local_68 = 0;
  local_60 = 1;
  local_50[0] = 0x2f;
  local_a0._8_8_ = 1;
  local_88 = 0;
  local_90 = local_50;
  local_58 = local_50;
  local_80 = strlen(name);
  local_70 = 0;
  views_00._M_len = 3;
  views_00._M_array = (iterator)&local_b0;
  local_78 = name;
  cmCatViews((string *)&local_d0,views_00);
  bVar2 = cmsys::SystemTools::FileExists((string *)&local_f0);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    bVar2 = cmsys::SystemTools::FileExists((string *)&local_d0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar2) {
      paVar5 = &local_c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_allocated_capacity == paVar5) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_c0._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_c0._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_d0._M_allocated_capacity;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_c0._M_allocated_capacity;
      }
      paVar1 = &local_d0;
      goto LAB_00399997;
    }
  }
  paVar5 = &local_e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_allocated_capacity == paVar5) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_e0._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_e0._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_f0._M_allocated_capacity;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_e0._M_allocated_capacity;
  }
  paVar1 = &local_f0;
LAB_00399997:
  psVar6 = (size_type *)(paVar1->_M_local_buf + 8);
  __return_storage_ptr__->_M_string_length = *psVar6;
  psVar6[-1] = (size_type)paVar5;
  *psVar6 = 0;
  paVar5->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_allocated_capacity != &local_c0) {
    operator_delete((void *)local_d0._M_allocated_capacity,local_c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_allocated_capacity == &local_e0) {
    return (string *)&local_e0;
  }
  operator_delete((void *)local_f0._M_allocated_capacity,local_e0._M_allocated_capacity + 1);
  return extraout_RAX_00;
}

Assistant:

static std::string FindInstallSource(cmMakefile& makefile, const char* name)
{
  if (cmSystemTools::FileIsFullPath(name) ||
      cmGeneratorExpression::Find(name) == 0) {
    // This is a full path.
    return name;
  }

  // This is a relative path.
  std::string tb = cmStrCat(makefile.GetCurrentBinaryDirectory(), '/', name);
  std::string ts = cmStrCat(makefile.GetCurrentSourceDirectory(), '/', name);

  if (cmSystemTools::FileExists(tb)) {
    // The file exists in the binary tree.  Use it.
    return tb;
  }
  if (cmSystemTools::FileExists(ts)) {
    // The file exists in the source tree.  Use it.
    return ts;
  }
  // The file doesn't exist.  Assume it will be present in the
  // binary tree when the install occurs.
  return tb;
}